

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

String * __thiscall kj::_::TraceBuilder::toString(String *__return_storage_ptr__,TraceBuilder *this)

{
  kj *this_00;
  void **ppvVar1;
  ArrayPtr<void_*const> trace;
  String *in_RCX;
  ArrayPtr<void_*const> trace_00;
  char *in_stack_ffffffffffffffb8;
  Array<char> local_30;
  
  this_00 = (kj *)this->start;
  ppvVar1 = this->current;
  trace.size_ = (size_t)in_stack_ffffffffffffffb8;
  trace.ptr = (void **)0x35b5de;
  stringifyStackTraceAddresses(trace);
  trace_00.size_ = (size_t)in_RCX;
  trace_00.ptr = (void **)((long)ppvVar1 - (long)this_00 >> 3);
  stringifyStackTrace((String *)&stack0xffffffffffffffb8,this_00,trace_00);
  str<kj::String,kj::String>
            (__return_storage_ptr__,(kj *)&local_30,(String *)&stack0xffffffffffffffb8,in_RCX);
  Array<char>::~Array((Array<char> *)&stack0xffffffffffffffb8);
  Array<char>::~Array(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String TraceBuilder::toString() {
  auto result = finish();
  return kj::str(stringifyStackTraceAddresses(result),
                 stringifyStackTrace(result));
}